

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O1

void __thiscall pmx::PmxMorph::Read(PmxMorph *this,istream *stream,PmxSetting *setting)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PmxMorphGroupOffset *pPVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Alloc_hider _Var6;
  PmxMorphUVOffset *pPVar7;
  PmxMorphBoneOffset *pPVar8;
  PmxMorphVertexOffset *pPVar9;
  PmxMorphMaterialOffset *pPVar10;
  runtime_error *this_00;
  uint8_t in_CL;
  long lVar11;
  PmxMorphUVOffset *pPVar12;
  PmxMorphBoneOffset *pPVar13;
  PmxMorphVertexOffset *pPVar14;
  PmxMorphMaterialOffset *pPVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->morph_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)&this->category);
  std::istream::read((char *)stream,(long)&this->morph_type);
  piVar1 = &this->offset_count;
  std::istream::read((char *)stream,(long)piVar1);
  switch(this->morph_type) {
  case Group:
    mmd::make_unique<pmx::PmxMorphGroupOffset[]>((mmd *)&local_50,(long)this->offset_count);
    _Var6._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    pPVar3 = (this->group_offsets)._M_t.
             super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
             .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
    (this->group_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl =
         (PmxMorphGroupOffset *)_Var6._M_p;
    if (pPVar3 != (PmxMorphGroupOffset *)0x0) {
      operator_delete__(pPVar3);
    }
    if (local_50._M_dataplus._M_p != (pointer)0x0) {
      operator_delete__(local_50._M_dataplus._M_p);
    }
    if (0 < *piVar1) {
      lVar11 = 0;
      lVar18 = 0;
      do {
        pPVar3 = (this->group_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)
                    ((long)&(pPVar3->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar11))
                  ((long)&(pPVar3->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar11,stream,
                   setting);
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Vertex:
    uVar17 = (ulong)*piVar1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar17;
    uVar16 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
      uVar16 = SUB168(auVar5 * ZEXT816(0x18),0);
    }
    pPVar9 = (PmxMorphVertexOffset *)operator_new__(uVar16);
    if (uVar17 != 0) {
      pPVar14 = pPVar9;
      do {
        (pPVar14->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_008ccd50;
        pPVar14->vertex_index = 0;
        pPVar14->position_offset[0] = 0.0;
        pPVar14->position_offset[1] = 0.0;
        pPVar14->position_offset[2] = 0.0;
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != pPVar9 + uVar17);
    }
    pPVar14 = (this->vertex_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
    (this->vertex_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl = pPVar9;
    if (pPVar14 != (PmxMorphVertexOffset *)0x0) {
      operator_delete__(pPVar14);
    }
    if (0 < *piVar1) {
      lVar11 = 0;
      lVar18 = 0;
      do {
        pPVar9 = (this->vertex_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar9->position_offset + lVar11 + -0xc))
                  ((long)pPVar9->position_offset + lVar11 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Bone:
    uVar17 = (ulong)*piVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar17;
    uVar16 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
      uVar16 = SUB168(auVar4 * ZEXT816(0x28),0);
    }
    pPVar8 = (PmxMorphBoneOffset *)operator_new__(uVar16);
    if (uVar17 != 0) {
      pPVar13 = pPVar8;
      do {
        (pPVar13->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_008ccdb0;
        pPVar13->bone_index = 0;
        pPVar13->translation[0] = 0.0;
        pPVar13->translation[1] = 0.0;
        pPVar13->translation[2] = 0.0;
        pPVar13->rotation[0] = 0.0;
        pPVar13->rotation[1] = 0.0;
        pPVar13->rotation[2] = 0.0;
        pPVar13->rotation[3] = 0.0;
        pPVar13 = pPVar13 + 1;
      } while (pPVar13 != pPVar8 + uVar17);
    }
    pPVar13 = (this->bone_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
    (this->bone_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>.
    _M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl = pPVar8;
    if (pPVar13 != (PmxMorphBoneOffset *)0x0) {
      operator_delete__(pPVar13);
    }
    if (0 < *piVar1) {
      lVar11 = 0;
      lVar18 = 0;
      do {
        pPVar8 = (this->bone_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar8->translation + lVar11 + -0xc))
                  ((long)pPVar8->translation + lVar11 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x28;
      } while (lVar18 < this->offset_count);
    }
    break;
  case UV:
  case AdditionalUV1:
  case AdditionalUV2:
  case AdditionalUV3:
  case AdditionalUV4:
    lVar11 = (long)*piVar1;
    uVar16 = 0xffffffffffffffff;
    if (-1 < lVar11) {
      uVar16 = lVar11 * 0x20;
    }
    pPVar7 = (PmxMorphUVOffset *)operator_new__(uVar16);
    if (lVar11 != 0) {
      pPVar12 = pPVar7;
      do {
        (pPVar12->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_008ccd80;
        pPVar12->vertex_index = 0;
        pPVar12->uv_offset[0] = 0.0;
        pPVar12->uv_offset[1] = 0.0;
        pPVar12->uv_offset[2] = 0.0;
        pPVar12->uv_offset[3] = 0.0;
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar7 + lVar11);
    }
    pPVar12 = (this->uv_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
    (this->uv_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>._M_t
    .super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>.
    super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl = pPVar7;
    if (pPVar12 != (PmxMorphUVOffset *)0x0) {
      operator_delete__(pPVar12);
    }
    if (0 < *piVar1) {
      lVar11 = 0;
      lVar18 = 0;
      do {
        pPVar7 = (this->uv_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar7->uv_offset + lVar11 + -0xc))
                  ((long)pPVar7->uv_offset + lVar11 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Matrial:
    lVar11 = (long)*piVar1;
    uVar16 = 0xffffffffffffffff;
    if (-1 < lVar11) {
      uVar16 = lVar11 * 0x80;
    }
    pPVar10 = (PmxMorphMaterialOffset *)operator_new__(uVar16);
    if (lVar11 != 0) {
      pPVar15 = pPVar10;
      do {
        (pPVar15->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_008ccde0;
        pPVar15->diffuse[0] = 0.0;
        pPVar15->diffuse[1] = 0.0;
        pPVar15->diffuse[2] = 0.0;
        pPVar15->diffuse[3] = 0.0;
        pPVar15->specular[0] = 0.0;
        pPVar15->specular[1] = 0.0;
        *(undefined8 *)(pPVar15->specular + 2) = 0;
        pPVar15->ambient[0] = 0.0;
        pPVar15->ambient[1] = 0.0;
        *(undefined8 *)(pPVar15->ambient + 2) = 0;
        pPVar15->edge_color[1] = 0.0;
        pPVar15->edge_color[2] = 0.0;
        *(undefined8 *)(pPVar15->edge_color + 3) = 0;
        pPVar15->texture_argb[0] = 0.0;
        pPVar15->texture_argb[1] = 0.0;
        pPVar15->texture_argb[2] = 0.0;
        pPVar15->texture_argb[3] = 0.0;
        pPVar15->sphere_texture_argb[0] = 0.0;
        pPVar15->sphere_texture_argb[1] = 0.0;
        pPVar15->sphere_texture_argb[2] = 0.0;
        pPVar15->sphere_texture_argb[3] = 0.0;
        pPVar15->toon_texture_argb[0] = 0.0;
        pPVar15->toon_texture_argb[1] = 0.0;
        pPVar15->toon_texture_argb[2] = 0.0;
        pPVar15->toon_texture_argb[3] = 0.0;
        pPVar15 = pPVar15 + 1;
      } while (pPVar15 != pPVar10 + lVar11);
    }
    pPVar15 = (this->material_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
    (this->material_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl = pPVar10;
    if (pPVar15 != (PmxMorphMaterialOffset *)0x0) {
      operator_delete__(pPVar15);
    }
    if (0 < *piVar1) {
      lVar11 = 0;
      lVar18 = 0;
      do {
        pPVar10 = (this->material_offsets)._M_t.
                  super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                  .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar10->diffuse + lVar11 + -0x10))
                  ((long)pPVar10->diffuse + lVar11 + -0x10,stream,setting);
        lVar18 = lVar18 + 1;
        lVar11 = lVar11 + 0x80;
      } while (lVar18 < this->offset_count);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"MMD: unknown morth type","");
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void PmxMorph::Read(std::istream *stream, PmxSetting *setting)
	{
		this->morph_name = ReadString(stream, setting->encoding);
		this->morph_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &category, sizeof(MorphCategory));
		stream->read((char*) &morph_type, sizeof(MorphType));
		stream->read((char*) &this->offset_count, sizeof(int));
		switch (this->morph_type)
		{
		case MorphType::Group:
			group_offsets = mmd::make_unique<PmxMorphGroupOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				group_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Vertex:
			vertex_offsets = mmd::make_unique<PmxMorphVertexOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				vertex_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Bone:
			bone_offsets = mmd::make_unique<PmxMorphBoneOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				bone_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Matrial:
			material_offsets = mmd::make_unique<PmxMorphMaterialOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				material_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::UV:
		case MorphType::AdditionalUV1:
		case MorphType::AdditionalUV2:
		case MorphType::AdditionalUV3:
		case MorphType::AdditionalUV4:
			uv_offsets = mmd::make_unique<PmxMorphUVOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				uv_offsets[i].Read(stream, setting);
			}
			break;
		default:
            throw DeadlyImportError("MMD: unknown morth type");
		}
	}